

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossPlatformReporters.cpp
# Opt level: O0

void __thiscall
ApprovalTests::CrossPlatform::CrossPlatformDiffReporter::CrossPlatformDiffReporter
          (CrossPlatformDiffReporter *this)

{
  initializer_list<ApprovalTests::Reporter_*> __l;
  allocator_type *this_00;
  undefined8 *in_RDI;
  VisualStudioCodeReporter *unaff_retaddr;
  allocator_type *__a;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *this_01;
  iterator ppRVar1;
  size_type in_stack_ffffffffffffffe0;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
  *in_stack_ffffffffffffffe8;
  FirstWorkingReporter *in_stack_fffffffffffffff0;
  
  this_00 = (allocator_type *)operator_new(0x70);
  VisualStudioCodeReporter::VisualStudioCodeReporter(unaff_retaddr);
  this_01 = (vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
            &stack0xffffffffffffffc8;
  ppRVar1 = (iterator)0x1;
  __a = this_00;
  ::std::allocator<ApprovalTests::Reporter_*>::allocator
            ((allocator<ApprovalTests::Reporter_*> *)0x16af6b);
  __l._M_len = in_stack_ffffffffffffffe0;
  __l._M_array = ppRVar1;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            (this_01,__l,__a);
  FirstWorkingReporter::FirstWorkingReporter(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::~vector
            ((vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
             this_00);
  ::std::allocator<ApprovalTests::Reporter_*>::~allocator
            ((allocator<ApprovalTests::Reporter_*> *)0x16afab);
  *in_RDI = &PTR__CrossPlatformDiffReporter_00299350;
  return;
}

Assistant:

CrossPlatformDiffReporter::CrossPlatformDiffReporter()
            : FirstWorkingReporter({
                  // begin-snippet: cross_platform_diff_reporters
                  new VisualStudioCodeReporter(),
                  // end-snippet
              })
        {
        }